

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn.cpp
# Opt level: O2

Vector __thiscall KNNClassifier::predict(KNNClassifier *this,SparseMatrix *X)

{
  uint uVar1;
  Scalar *pSVar2;
  SparseMatrix *in_RDX;
  Index extraout_RDX;
  Index IVar3;
  Index extraout_RDX_00;
  int i;
  long index;
  Vector VVar4;
  Index local_30;
  
  local_30 = in_RDX->m_outerSize;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,&local_30);
  IVar3 = extraout_RDX;
  for (index = 0; index < in_RDX->m_outerSize; index = index + 1) {
    uVar1 = predecirFila((KNNClassifier *)X,in_RDX,(int)index);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,index);
    *pSVar2 = (double)(int)uVar1;
    IVar3 = extraout_RDX_00;
  }
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar3;
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector KNNClassifier::predict(SparseMatrix X)
{
  auto result = Vector(X.rows());

  for (int i = 0; i < X.rows(); i++)
    result(i) = predecirFila(X, i);

  return result;
}